

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.h
# Opt level: O2

Orphan<capnp::List<capnproto_test::capnp::test::TestMembrane::Thing,_(capnp::Kind)5>_> * __thiscall
capnp::
copyOutOfMembrane<capnp::List<capnproto_test::capnp::test::TestMembrane::Thing,(capnp::Kind)5>::Reader>
          (Orphan<capnp::List<capnproto_test::capnp::test::TestMembrane::Thing,_(capnp::Kind)5>_>
           *__return_storage_ptr__,capnp *this,Reader *from,Orphanage to,
          Own<capnp::MembranePolicy> *policy)

{
  ListReader from_00;
  CapTableBuilder *pCVar1;
  Orphanage to_00;
  Own<capnp::MembranePolicy> local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  OrphanBuilder local_28;
  
  pCVar1 = to.capTable;
  local_58 = *(undefined8 *)this;
  uStack_50 = *(undefined8 *)(this + 8);
  local_48 = *(undefined8 *)(this + 0x10);
  uStack_40 = *(undefined8 *)(this + 0x18);
  local_38 = *(undefined8 *)(this + 0x20);
  uStack_30 = *(undefined8 *)(this + 0x28);
  from_00 = *(ListReader *)this;
  local_68.disposer = (Disposer *)(pCVar1->super_CapTableReader)._vptr_CapTableReader;
  local_68.ptr = (MembranePolicy *)pCVar1[1].super_CapTableReader._vptr_CapTableReader;
  pCVar1[1].super_CapTableReader._vptr_CapTableReader = (_func_int **)0x0;
  to_00.capTable = (CapTableBuilder *)to.arena;
  to_00.arena = (BuilderArena *)from;
  _::copyOutOfMembrane(&local_28,from_00,to_00,&local_68,false);
  (__return_storage_ptr__->builder).segment = local_28.segment;
  (__return_storage_ptr__->builder).capTable = local_28.capTable;
  (__return_storage_ptr__->builder).location = local_28.location;
  local_28.segment = (SegmentBuilder *)0x0;
  (__return_storage_ptr__->builder).tag.content = local_28.tag.content;
  local_28.location = (word *)0x0;
  _::OrphanBuilder::~OrphanBuilder(&local_28);
  kj::Own<capnp::MembranePolicy>::dispose(&local_68);
  return __return_storage_ptr__;
}

Assistant:

Orphan<typename kj::Decay<Reader>::Reads> copyOutOfMembrane(
    Reader&& from, Orphanage to, kj::Own<MembranePolicy> policy) {
  return _::copyOutOfMembrane(
      _::PointerHelpers<typename kj::Decay<Reader>::Reads>::getInternalReader(from),
      to, kj::mv(policy), false);
}